

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O3

void duckdb::DateDiffFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long *puVar2;
  uint *puVar3;
  DatePartSpecifier DVar4;
  reference a;
  reference b;
  reference c;
  NotImplementedException *this;
  uint *puVar5;
  string local_50;
  
  a = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  b = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  c = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  if (a->vector_type != CONSTANT_VECTOR) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,args->count,
               DateDiffTernaryOperator::
               Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>);
    return;
  }
  puVar2 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  puVar3 = (uint *)a->data;
  if ((ulong)*puVar3 < 0xd) {
    puVar5 = puVar3 + 1;
  }
  else {
    puVar5 = *(uint **)(puVar3 + 2);
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,puVar5,(ulong)*puVar3 + (long)puVar5);
  DVar4 = GetDatePartSpecifier(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (DVar4 < BEGIN_INVALID) {
    switch(DVar4) {
    case BEGIN_BIGINT:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::YearOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MONTH:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MonthOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    default:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::DayOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case DECADE:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::DecadeOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case CENTURY:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::CenturyOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MILLENNIUM:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MilleniumOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MICROSECONDS:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MicrosecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MILLISECONDS:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MillisecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::SecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MINUTE:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MinutesOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case HOUR:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::HoursOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case WEEK:
    case YEARWEEK:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::WeekOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case ISOYEAR:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::ISOYearOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case QUARTER:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::QuarterOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result,args->count);
      break;
    case ERA:
    case TIMEZONE:
    case TIMEZONE_HOUR:
    case TIMEZONE_MINUTE:
      goto switchD_019a5f9f_caseD_12;
    }
    return;
  }
switchD_019a5f9f_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Specifier type not implemented for DATEDIFF","");
  NotImplementedException::NotImplementedException(this,&local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void DateDiffFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);
	auto &part_arg = args.data[0];
	auto &start_arg = args.data[1];
	auto &end_arg = args.data[2];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateDiffBinaryExecutor<T, T, int64_t>(type, start_arg, end_arg, result, args.size());
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<string_t, T, T, int64_t>(
		    part_arg, start_arg, end_arg, result, args.size(),
		    DateDiffTernaryOperator::Operation<string_t, T, T, int64_t>);
	}
}